

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.h
# Opt level: O2

PrimInfo * __thiscall
embree::avx2::LineSegmentsISA::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,LineSegmentsISA *this,PrimRef *prims,
          range<unsigned_long> *r,size_t k,uint geomID)

{
  uint uVar1;
  BufferView<embree::Vec3fx> *pBVar2;
  char *pcVar3;
  size_t sVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  float fVar7;
  size_t sVar8;
  size_t sVar9;
  long lVar10;
  unsigned_long uVar11;
  ulong uVar12;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar15 [64];
  undefined1 auVar17 [64];
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar11 = r->_begin;
  auVar16._8_4_ = 0x7f800000;
  auVar16._0_8_ = 0x7f8000007f800000;
  auVar16._12_4_ = 0x7f800000;
  auVar17 = ZEXT1664(auVar16);
  auVar14._8_4_ = 0xff800000;
  auVar14._0_8_ = 0xff800000ff800000;
  auVar14._12_4_ = 0xff800000;
  auVar15 = ZEXT1664(auVar14);
  sVar8 = 0;
  auVar18._8_4_ = 0xddccb9a2;
  auVar18._0_8_ = 0xddccb9a2ddccb9a2;
  auVar18._12_4_ = 0xddccb9a2;
  auVar19._8_4_ = 0x5dccb9a2;
  auVar19._0_8_ = 0x5dccb9a25dccb9a2;
  auVar19._12_4_ = 0x5dccb9a2;
  auVar20 = ZEXT1664(auVar14);
  auVar21 = ZEXT1664(auVar16);
  while( true ) {
    if (r->_end <= uVar11) break;
    pBVar2 = (this->super_LineSegments).vertices.items;
    uVar1 = *(uint *)(*(long *)&(this->super_LineSegments).super_Geometry.field_0x58 +
                     *(long *)&(this->super_LineSegments).field_0x68 * uVar11);
    uVar12 = (ulong)(uVar1 + 1);
    sVar9 = k;
    if (uVar12 < (pBVar2->super_RawBufferView).num) {
      pcVar3 = (pBVar2->super_RawBufferView).ptr_ofs;
      sVar4 = (pBVar2->super_RawBufferView).stride;
      auVar14 = *(undefined1 (*) [16])(pcVar3 + sVar4 * uVar1);
      auVar16 = vcmpps_avx(auVar14,auVar18,2);
      auVar22 = vcmpps_avx(auVar14,auVar19,5);
      auVar16 = vorps_avx(auVar16,auVar22);
      if ((((auVar16 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar16 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar16 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar16[0xf])
      {
        auVar16 = *(undefined1 (*) [16])(pcVar3 + sVar4 * uVar12);
        auVar22 = vcmpps_avx(auVar16,auVar18,2);
        auVar23 = vcmpps_avx(auVar16,auVar19,5);
        auVar22 = vorps_avx(auVar22,auVar23);
        if ((((auVar22 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar22 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar22 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar22[0xf]
           ) {
          auVar14 = vshufps_avx(auVar14,auVar14,0xff);
          auVar16 = vshufps_avx(auVar16,auVar16,0xff);
          auVar14 = vminss_avx(auVar14,auVar16);
          if (0.0 <= auVar14._0_4_) {
            pcVar3 = (this->super_LineSegments).vertices0.super_RawBufferView.ptr_ofs;
            sVar9 = (this->super_LineSegments).vertices0.super_RawBufferView.stride;
            lVar10 = uVar1 * sVar9;
            lVar13 = uVar12 * sVar9;
            auVar22 = vminps_avx(*(undefined1 (*) [16])(pcVar3 + lVar10),
                                 *(undefined1 (*) [16])(pcVar3 + lVar13));
            auVar16 = vmaxss_avx(ZEXT416(*(uint *)(pcVar3 + lVar13 + 0xc)),
                                 ZEXT416(*(uint *)(pcVar3 + lVar10 + 0xc)));
            auVar14 = vmaxps_avx(*(undefined1 (*) [16])(pcVar3 + lVar10),
                                 *(undefined1 (*) [16])(pcVar3 + lVar13));
            fVar7 = auVar16._0_4_ * (this->super_LineSegments).maxRadiusScale;
            auVar23._4_4_ = fVar7;
            auVar23._0_4_ = fVar7;
            auVar23._8_4_ = fVar7;
            auVar23._12_4_ = fVar7;
            auVar16 = vsubps_avx(auVar22,auVar23);
            aVar5 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                    vinsertps_avx(auVar16,ZEXT416(geomID),0x30);
            auVar22._0_4_ = auVar14._0_4_ + fVar7;
            auVar22._4_4_ = auVar14._4_4_ + fVar7;
            auVar22._8_4_ = auVar14._8_4_ + fVar7;
            auVar22._12_4_ = auVar14._12_4_ + fVar7;
            aVar6 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                    vinsertps_avx(auVar22,ZEXT416((uint)uVar11),0x30);
            auVar14 = vminps_avx((undefined1  [16])auVar21._0_16_,(undefined1  [16])aVar5);
            auVar21 = ZEXT1664(auVar14);
            auVar14 = vmaxps_avx((undefined1  [16])auVar20._0_16_,(undefined1  [16])aVar6);
            auVar20 = ZEXT1664(auVar14);
            auVar24._0_4_ = aVar5.x + aVar6.x;
            auVar24._4_4_ = aVar5.y + aVar6.y;
            auVar24._8_4_ = aVar5.z + aVar6.z;
            auVar24._12_4_ = aVar5.field_3.w + aVar6.field_3.w;
            auVar14 = vminps_avx((undefined1  [16])auVar17._0_16_,auVar24);
            auVar17 = ZEXT1664(auVar14);
            auVar14 = vmaxps_avx((undefined1  [16])auVar15._0_16_,auVar24);
            auVar15 = ZEXT1664(auVar14);
            sVar8 = sVar8 + 1;
            sVar9 = k + 1;
            prims[k].upper.field_0.field_1 = aVar6;
            prims[k].lower.field_0.field_1 = aVar5;
          }
        }
      }
    }
    uVar11 = uVar11 + 1;
    k = sVar9;
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       auVar21._0_16_;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       auVar20._0_16_;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       auVar17._0_16_;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       auVar15._0_16_;
  __return_storage_ptr__->end = sVar8;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          BBox3fa bounds = empty;
          if (!buildBounds(j,&bounds)) continue;
          const PrimRef prim(bounds,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }